

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_class.h
# Opt level: O1

void dukglue_register_constructor<Dog,std::__cxx11::string_const&>(duk_context *ctx,char *name)

{
  TypeInfo local_20;
  
  duk_push_c_function(ctx,dukglue::detail::
                          call_native_constructor<false,Dog,std::__cxx11::string_const&>,1);
  local_20.index_._M_target = (type_info *)&Dog::typeinfo;
  local_20.base_ = (TypeInfo *)0x0;
  dukglue::detail::ProtoManager::push_prototype(ctx,&local_20);
  duk_put_prop_string(ctx,-2,"prototype");
  duk_put_global_string(ctx,name);
  return;
}

Assistant:

void dukglue_register_constructor(duk_context* ctx, const char* name)
{
	duk_c_function constructor_func = dukglue::detail::call_native_constructor<false, Cls, Ts...>;

	duk_push_c_function(ctx, constructor_func, sizeof...(Ts));

	// set constructor_func.prototype
	dukglue::detail::ProtoManager::push_prototype<Cls>(ctx);
	duk_put_prop_string(ctx, -2, "prototype");

	// set name = constructor_func
	duk_put_global_string(ctx, name);
}